

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::mouseMoveEvent(Picker *this,QMouseEvent *event)

{
  PickerPrivate *pPVar1;
  QMouseEvent QVar2;
  int iVar3;
  QPoint QVar4;
  int iVar5;
  double dVar6;
  double in_XMM1_Qa;
  
  pPVar1 = (this->d).d;
  if (pPVar1->leftMouseButtonPressed == true) {
    pPVar1->mouseWasMoved = true;
    QEventPoint::position();
    pPVar1 = (this->d).d;
    iVar3 = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_0017f240) +
                 in_XMM1_Qa) - (pPVar1->mousePos).yp;
    iVar5 = -iVar3;
    if (0 < iVar3) {
      iVar5 = iVar3;
    }
    pPVar1->mouseMoveDelta = pPVar1->mouseMoveDelta + iVar5;
    pPVar1->drawItemOffset = pPVar1->drawItemOffset + iVar3;
    dVar6 = (double)QEventPoint::position();
    QVar4.xp = (int)((double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6);
    QVar4.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    ((this->d).d)->mousePos = QVar4;
    QWidget::update();
    QVar2 = (QMouseEvent)0x1;
  }
  else {
    QVar2 = (QMouseEvent)0x0;
  }
  event[0xc] = QVar2;
  return;
}

Assistant:

void
Picker::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		d->mouseWasMoved = true;

		const int delta = event->pos().y() - d->mousePos.y();
		d->mouseMoveDelta += qAbs( delta );
		d->drawItemOffset += delta;
		d->mousePos = event->pos();
		update();

		event->accept();
	}
	else
		event->ignore();
}